

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::Array<capnp::word>_> * __thiscall
kj::ArrayBuilder<kj::Array<capnp::word>_>::operator=
          (ArrayBuilder<kj::Array<capnp::word>_> *this,ArrayBuilder<kj::Array<capnp::word>_> *other)

{
  Array<capnp::word> *pAVar1;
  RemoveConst<kj::Array<capnp::word>_> *pRVar2;
  Array<capnp::word> *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (Array<capnp::word> *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (Array<capnp::word> *)0x0;
    this->pos = (RemoveConst<kj::Array<capnp::word>_> *)0x0;
    this->endPtr = (Array<capnp::word> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pAVar1,0x18,((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Array<capnp::word>,_false>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Array<capnp::word> *)0x0;
  other->pos = (RemoveConst<kj::Array<capnp::word>_> *)0x0;
  other->endPtr = (Array<capnp::word> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }